

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.cpp
# Opt level: O2

void duckdb::BinFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *this;
  ScalarFunctionSet *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  initializer_list<duckdb::LogicalType> __l_01;
  initializer_list<duckdb::LogicalType> __l_02;
  initializer_list<duckdb::LogicalType> __l_03;
  initializer_list<duckdb::LogicalType> __l_04;
  allocator_type local_9a1;
  LogicalType local_9a0 [24];
  code *local_988 [2];
  code *local_978;
  code *local_970;
  code *local_968 [2];
  code *local_958;
  code *local_950;
  code *local_948 [2];
  code *local_938;
  code *local_930;
  code *local_928 [2];
  code *local_918;
  code *local_910;
  code *local_908 [2];
  code *local_8f8;
  code *local_8f0;
  code *local_8e8 [2];
  code *local_8d8;
  code *local_8d0;
  LogicalType local_8c8 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_8b0;
  LogicalType local_898 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_880;
  LogicalType local_868 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_850;
  LogicalType local_838 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_820;
  LogicalType local_808 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_7f0;
  LogicalType local_7d8 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_7c0;
  LogicalType local_7a8 [24];
  LogicalType local_790 [24];
  LogicalType local_778 [24];
  LogicalType local_760 [24];
  LogicalType local_748 [24];
  LogicalType local_730 [24];
  ScalarFunction local_718;
  ScalarFunction local_5f0;
  ScalarFunction local_4c8;
  ScalarFunction local_3a0;
  ScalarFunction local_278;
  ScalarFunction local_150;
  
  duckdb::ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  duckdb::LogicalType::LogicalType(local_9a0,VARCHAR);
  __l._M_len = 1;
  __l._M_array = local_9a0;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_7c0,__l,&local_9a1);
  duckdb::LogicalType::LogicalType(local_7d8,VARCHAR);
  local_8e8[1] = (code *)0x0;
  local_8e8[0] = ToBinaryFunction<duckdb::string_t,duckdb::BinaryStrOperator>;
  local_8d0 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_8d8 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_730,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_150,&local_7c0,local_7d8,local_8e8,0,0,0,0,local_730,0,0,0);
  this = (vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)(in_RDI + 0x20);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_150);
  ScalarFunction::~ScalarFunction(&local_150);
  duckdb::LogicalType::~LogicalType(local_730);
  std::_Function_base::~_Function_base((_Function_base *)local_8e8);
  duckdb::LogicalType::~LogicalType(local_7d8);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_7c0);
  duckdb::LogicalType::~LogicalType(local_9a0);
  duckdb::LogicalType::LogicalType(local_9a0,VARINT);
  __l_00._M_len = 1;
  __l_00._M_array = local_9a0;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_7f0,__l_00,&local_9a1);
  duckdb::LogicalType::LogicalType(local_808,VARCHAR);
  local_908[1] = (code *)0x0;
  local_908[0] = ToBinaryFunction<duckdb::string_t,duckdb::BinaryStrOperator>;
  local_8f0 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_8f8 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_748,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_278,&local_7f0,local_808,local_908,0,0,0,0,local_748,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_278);
  ScalarFunction::~ScalarFunction(&local_278);
  duckdb::LogicalType::~LogicalType(local_748);
  std::_Function_base::~_Function_base((_Function_base *)local_908);
  duckdb::LogicalType::~LogicalType(local_808);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_7f0);
  duckdb::LogicalType::~LogicalType(local_9a0);
  duckdb::LogicalType::LogicalType(local_9a0,UBIGINT);
  __l_01._M_len = 1;
  __l_01._M_array = local_9a0;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_820,__l_01,&local_9a1);
  duckdb::LogicalType::LogicalType(local_838,VARCHAR);
  local_928[1] = (code *)0x0;
  local_928[0] = ToBinaryFunction<unsigned_long,duckdb::BinaryIntegralOperator>;
  local_910 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_918 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_760,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_3a0,&local_820,local_838,local_928,0,0,0,0,local_760,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_3a0);
  ScalarFunction::~ScalarFunction(&local_3a0);
  duckdb::LogicalType::~LogicalType(local_760);
  std::_Function_base::~_Function_base((_Function_base *)local_928);
  duckdb::LogicalType::~LogicalType(local_838);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_820);
  duckdb::LogicalType::~LogicalType(local_9a0);
  duckdb::LogicalType::LogicalType(local_9a0,BIGINT);
  __l_02._M_len = 1;
  __l_02._M_array = local_9a0;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_850,__l_02,&local_9a1);
  duckdb::LogicalType::LogicalType(local_868,VARCHAR);
  local_948[1] = (code *)0x0;
  local_948[0] = ToBinaryFunction<long,duckdb::BinaryIntegralOperator>;
  local_930 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_938 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_778,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_4c8,&local_850,local_868,local_948,0,0,0,0,local_778,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_4c8);
  ScalarFunction::~ScalarFunction(&local_4c8);
  duckdb::LogicalType::~LogicalType(local_778);
  std::_Function_base::~_Function_base((_Function_base *)local_948);
  duckdb::LogicalType::~LogicalType(local_868);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_850);
  duckdb::LogicalType::~LogicalType(local_9a0);
  duckdb::LogicalType::LogicalType(local_9a0,HUGEINT);
  __l_03._M_len = 1;
  __l_03._M_array = local_9a0;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_880,__l_03,&local_9a1);
  duckdb::LogicalType::LogicalType(local_898,VARCHAR);
  local_968[1] = (code *)0x0;
  local_968[0] = ToBinaryFunction<duckdb::hugeint_t,duckdb::BinaryHugeIntOperator>;
  local_950 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_958 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_790,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_5f0,&local_880,local_898,local_968,0,0,0,0,local_790,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_5f0);
  ScalarFunction::~ScalarFunction(&local_5f0);
  duckdb::LogicalType::~LogicalType(local_790);
  std::_Function_base::~_Function_base((_Function_base *)local_968);
  duckdb::LogicalType::~LogicalType(local_898);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_880);
  duckdb::LogicalType::~LogicalType(local_9a0);
  duckdb::LogicalType::LogicalType(local_9a0,UHUGEINT);
  __l_04._M_len = 1;
  __l_04._M_array = local_9a0;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_8b0,__l_04,&local_9a1);
  duckdb::LogicalType::LogicalType(local_8c8,VARCHAR);
  local_988[1] = (code *)0x0;
  local_988[0] = ToBinaryFunction<duckdb::uhugeint_t,duckdb::BinaryUhugeIntOperator>;
  local_970 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_978 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_7a8,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_718,&local_8b0,local_8c8,local_988,0,0,0,0,local_7a8,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_718);
  ScalarFunction::~ScalarFunction(&local_718);
  duckdb::LogicalType::~LogicalType(local_7a8);
  std::_Function_base::~_Function_base((_Function_base *)local_988);
  duckdb::LogicalType::~LogicalType(local_8c8);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_8b0);
  duckdb::LogicalType::~LogicalType(local_9a0);
  return;
}

Assistant:

ScalarFunctionSet BinFun::GetFunctions() {
	ScalarFunctionSet to_binary;

	to_binary.AddFunction(
	    ScalarFunction({LogicalType::VARCHAR}, LogicalType::VARCHAR, ToBinaryFunction<string_t, BinaryStrOperator>));
	to_binary.AddFunction(
	    ScalarFunction({LogicalType::VARINT}, LogicalType::VARCHAR, ToBinaryFunction<string_t, BinaryStrOperator>));
	to_binary.AddFunction(ScalarFunction({LogicalType::UBIGINT}, LogicalType::VARCHAR,
	                                     ToBinaryFunction<uint64_t, BinaryIntegralOperator>));
	to_binary.AddFunction(
	    ScalarFunction({LogicalType::BIGINT}, LogicalType::VARCHAR, ToBinaryFunction<int64_t, BinaryIntegralOperator>));
	to_binary.AddFunction(ScalarFunction({LogicalType::HUGEINT}, LogicalType::VARCHAR,
	                                     ToBinaryFunction<hugeint_t, BinaryHugeIntOperator>));
	to_binary.AddFunction(ScalarFunction({LogicalType::UHUGEINT}, LogicalType::VARCHAR,
	                                     ToBinaryFunction<uhugeint_t, BinaryUhugeIntOperator>));
	return to_binary;
}